

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_isResolvedUnitsWithNonStandardChild_Test::TestBody
          (Importer_isResolvedUnitsWithNonStandardChild_Test *this)

{
  byte bVar1;
  AssertHelper local_80 [8];
  Message local_78 [8];
  UnitsPtr units;
  char *local_60 [4];
  UnitsPtr unitsBumble;
  ModelPtr model;
  AssertionResult gtest_ar_;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"model",(allocator<char> *)&units);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"units",(allocator<char> *)&unitsBumble);
  libcellml::Units::create((string *)&units);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"bumble",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&unitsBumble);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"bumble",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit
            ((string *)units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)local_60);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = libcellml::Units::requiresImports();
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_60,&gtest_ar_.success_,"units->requiresImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x3a3,local_60[0]);
    testing::internal::AssertHelper::operator=(local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    std::__cxx11::string::~string((string *)local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&unitsBumble.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsWithNonStandardChild)
{
    auto model = libcellml::Model::create("model");
    auto units = libcellml::Units::create("units");
    auto unitsBumble = libcellml::Units::create("bumble");
    units->addUnit("bumble");

    model->addUnits(units);
    model->addUnits(unitsBumble);

    EXPECT_FALSE(units->requiresImports());
}